

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * SSL_ERROR_to_str(int err)

{
  char *pcStack_10;
  int err_local;
  
  switch(err) {
  case 0:
    pcStack_10 = "SSL_ERROR_NONE";
    break;
  case 1:
    pcStack_10 = "SSL_ERROR_SSL";
    break;
  case 2:
    pcStack_10 = "SSL_ERROR_WANT_READ";
    break;
  case 3:
    pcStack_10 = "SSL_ERROR_WANT_WRITE";
    break;
  case 4:
    pcStack_10 = "SSL_ERROR_WANT_X509_LOOKUP";
    break;
  case 5:
    pcStack_10 = "SSL_ERROR_SYSCALL";
    break;
  case 6:
    pcStack_10 = "SSL_ERROR_ZERO_RETURN";
    break;
  case 7:
    pcStack_10 = "SSL_ERROR_WANT_CONNECT";
    break;
  case 8:
    pcStack_10 = "SSL_ERROR_WANT_ACCEPT";
    break;
  case 9:
    pcStack_10 = "SSL_ERROR_WANT_ASYNC";
    break;
  case 10:
    pcStack_10 = "SSL_ERROR_WANT_ASYNC_JOB";
    break;
  default:
    pcStack_10 = "SSL_ERROR unknown";
  }
  return pcStack_10;
}

Assistant:

static const char *SSL_ERROR_to_str(int err)
{
  switch(err) {
  case SSL_ERROR_NONE:
    return "SSL_ERROR_NONE";
  case SSL_ERROR_SSL:
    return "SSL_ERROR_SSL";
  case SSL_ERROR_WANT_READ:
    return "SSL_ERROR_WANT_READ";
  case SSL_ERROR_WANT_WRITE:
    return "SSL_ERROR_WANT_WRITE";
  case SSL_ERROR_WANT_X509_LOOKUP:
    return "SSL_ERROR_WANT_X509_LOOKUP";
  case SSL_ERROR_SYSCALL:
    return "SSL_ERROR_SYSCALL";
  case SSL_ERROR_ZERO_RETURN:
    return "SSL_ERROR_ZERO_RETURN";
  case SSL_ERROR_WANT_CONNECT:
    return "SSL_ERROR_WANT_CONNECT";
  case SSL_ERROR_WANT_ACCEPT:
    return "SSL_ERROR_WANT_ACCEPT";
#if defined(SSL_ERROR_WANT_ASYNC)
  case SSL_ERROR_WANT_ASYNC:
    return "SSL_ERROR_WANT_ASYNC";
#endif
#if defined(SSL_ERROR_WANT_ASYNC_JOB)
  case SSL_ERROR_WANT_ASYNC_JOB:
    return "SSL_ERROR_WANT_ASYNC_JOB";
#endif
#if defined(SSL_ERROR_WANT_EARLY)
  case SSL_ERROR_WANT_EARLY:
    return "SSL_ERROR_WANT_EARLY";
#endif
  default:
    return "SSL_ERROR unknown";
  }
}